

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O1

void do_sset(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  CHAR_DATA *ch_00;
  skill_type *psVar6;
  long lVar7;
  char arg3 [4608];
  char arg2 [4608];
  char arg1 [4608];
  char local_3628 [4608];
  char local_2428 [4608];
  char local_1228 [4616];
  
  pcVar5 = one_argument(argument,local_1228);
  pcVar5 = one_argument(pcVar5,local_2428);
  one_argument(pcVar5,local_3628);
  if (((local_1228[0] == '\0') || (local_2428[0] == '\0')) || (local_3628[0] == '\0')) {
    send_to_char("Syntax:\n\r",ch);
    send_to_char("  set skill <name> <spell or skill> <value>\n\r",ch);
    send_to_char("  set skill <name> all <value>\n\r",ch);
    pcVar5 = "   (use the name of the skill, not the number)\n\r";
  }
  else {
    ch_00 = get_char_world(ch,local_1228);
    if (ch_00 == (CHAR_DATA *)0x0) {
      pcVar5 = "They aren\'t here.\n\r";
    }
    else {
      bVar1 = is_npc(ch_00);
      if (bVar1) {
        pcVar5 = "Not on NPC\'s.\n\r";
      }
      else {
        bVar1 = str_cmp(local_2428,"all");
        uVar3 = 0;
        if ((bVar1) && (uVar3 = skill_lookup(local_2428), (int)uVar3 < 0)) {
          pcVar5 = "No such skill or spell.\n\r";
        }
        else {
          bVar2 = is_number(local_3628);
          if (bVar2) {
            uVar4 = atoi(local_3628);
            if (uVar4 == 0xfffffffe || uVar4 < 0x65) {
              if (bVar1) {
                ch_00->pcdata->learned[uVar3] = (short)uVar4;
                return;
              }
              psVar6 = skill_table;
              lVar7 = 0;
              do {
                if (psVar6->name != (char *)0x0) {
                  ch_00->pcdata->learned[lVar7] = (short)uVar4;
                }
                lVar7 = lVar7 + 1;
                psVar6 = psVar6 + 1;
              } while (lVar7 != 800);
              return;
            }
            pcVar5 = "Value range is 0 to 100 (-2 for permanent strip).\n\r";
          }
          else {
            pcVar5 = "Value must be numeric.\n\r";
          }
        }
      }
    }
  }
  send_to_char(pcVar5,ch);
  return;
}

Assistant:

void do_sset(CHAR_DATA *ch, char *argument)
{
	char arg1[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];
	char arg3[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;
	int value;
	int sn;
	bool fAll;

	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);
	argument = one_argument(argument, arg3);

	if (arg1[0] == '\0' || arg2[0] == '\0' || arg3[0] == '\0')
	{
		send_to_char("Syntax:\n\r", ch);
		send_to_char("  set skill <name> <spell or skill> <value>\n\r", ch);
		send_to_char("  set skill <name> all <value>\n\r", ch);
		send_to_char("   (use the name of the skill, not the number)\n\r", ch);
		return;
	}

	victim = get_char_world(ch, arg1);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (is_npc(victim))
	{
		send_to_char("Not on NPC's.\n\r", ch);
		return;
	}

	fAll = !str_cmp(arg2, "all");
	sn = 0;

	if (!fAll && (sn = skill_lookup(arg2)) < 0)
	{
		send_to_char("No such skill or spell.\n\r", ch);
		return;
	}

	/*
	 * Snarf the value.
	 */
	if (!is_number(arg3))
	{
		send_to_char("Value must be numeric.\n\r", ch);
		return;
	}

	value = atoi(arg3);

	if ((value < 0 || value > 100) && (value != -2))
	{
		send_to_char("Value range is 0 to 100 (-2 for permanent strip).\n\r", ch);
		return;
	}

	if (fAll)
	{
		for (sn = 0; sn < MAX_SKILL; sn++)
		{
			if (skill_table[sn].name != nullptr)
				victim->pcdata->learned[sn] = value;
		}
	}
	else
	{
		victim->pcdata->learned[sn] = value;
	}
}